

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gsl.hpp
# Opt level: O0

span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false> __thiscall
pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>::operator+
          (span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false> *this,difference_type n)

{
  span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false> *other;
  ptrdiff_t in_RDX;
  ptrdiff_t extraout_RDX;
  span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false> sVar1;
  undefined1 local_30 [8];
  span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false> ret;
  difference_type n_local;
  span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false> *this_local;
  
  ret.index_ = in_RDX;
  span_iterator((span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false> *)local_30,
                (span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false> *)n);
  other = operator+=((span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false> *)local_30,
                     ret.index_);
  span_iterator(this,other);
  sVar1.index_ = extraout_RDX;
  sVar1.span_ = (span<unsigned_char,__1L> *)this;
  return sVar1;
}

Assistant:

span_iterator operator+ (difference_type n) const noexcept {
                    auto ret = *this;
                    return ret += n;
                }